

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

_Bool IsFileExtension(char *fileName,char *ext)

{
  _Bool _Var1;
  char *pcVar2;
  char **ppcVar3;
  bool bVar4;
  int i;
  long lVar5;
  int extCount;
  char fileExtLower [16];
  
  pcVar2 = GetFileExtension(fileName);
  if (pcVar2 == (char *)0x0) {
    bVar4 = false;
  }
  else {
    extCount = 0;
    ppcVar3 = TextSplit(ext,';',&extCount);
    fileExtLower[0] = '\0';
    fileExtLower[1] = '\0';
    fileExtLower[2] = '\0';
    fileExtLower[3] = '\0';
    fileExtLower[4] = '\0';
    fileExtLower[5] = '\0';
    fileExtLower[6] = '\0';
    fileExtLower[7] = '\0';
    fileExtLower[8] = '\0';
    fileExtLower[9] = '\0';
    fileExtLower[10] = '\0';
    fileExtLower[0xb] = '\0';
    fileExtLower[0xc] = '\0';
    fileExtLower[0xd] = '\0';
    fileExtLower[0xe] = '\0';
    fileExtLower[0xf] = '\0';
    pcVar2 = TextToLower(pcVar2);
    strcpy(fileExtLower,pcVar2);
    lVar5 = 0;
    do {
      bVar4 = lVar5 < extCount;
      if (extCount <= lVar5) {
        return bVar4;
      }
      pcVar2 = TextToLower(ppcVar3[lVar5]);
      _Var1 = TextIsEqual(fileExtLower,pcVar2);
      lVar5 = lVar5 + 1;
    } while (!_Var1);
  }
  return bVar4;
}

Assistant:

bool IsFileExtension(const char *fileName, const char *ext)
{
    bool result = false;
    const char *fileExt = GetFileExtension(fileName);

    if (fileExt != NULL)
    {
#if defined(SUPPORT_TEXT_MANIPULATION)
        int extCount = 0;
        const char **checkExts = TextSplit(ext, ';', &extCount);

        char fileExtLower[16] = { 0 };
        strcpy(fileExtLower, TextToLower(fileExt));

        for (int i = 0; i < extCount; i++)
        {
            if (TextIsEqual(fileExtLower, TextToLower(checkExts[i])))
            {
                result = true;
                break;
            }
        }
#else
        if (strcmp(fileExt, ext) == 0) result = true;
#endif
    }

    return result;
}